

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<unsigned_char>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<unsigned_char> min,WrappedType<unsigned_char> max,float gridSize)

{
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  WrappedType<unsigned_char> WVar8;
  long lVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  char cVar13;
  byte bVar14;
  char cVar15;
  ushort uVar16;
  ushort uVar17;
  ulong uVar18;
  char cVar19;
  byte bVar20;
  char cVar21;
  uint uVar22;
  float fVar23;
  deRandom rnd;
  uint local_a4;
  ulong local_90;
  deRandom local_80;
  char *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  char *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar18 = (ulong)(uint)stride;
  if (stride == 0) {
    uVar18 = (ulong)(uint)componentCount;
  }
  iVar11 = (int)uVar18;
  local_38 = (ulong)(uint)(iVar11 * 2);
  iVar6 = iVar11 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar6 = 0;
  }
  local_70 = (char *)operator_new__((long)(iVar6 * count + offset));
  deRandom_init(&local_80,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar23 = (float)max.m_value - (float)min.m_value;
    uVar22 = -(uint)(-fVar23 <= fVar23);
    uVar7 = (uint)((float)(~uVar22 & (uint)-fVar23 | (uint)fVar23 & uVar22) * gridSize);
    uVar22 = 8;
    if (8 < (byte)uVar7) {
      uVar22 = uVar7;
    }
    if (0 < count) {
      local_48 = local_70 + offset;
      uVar7 = (uint)max.m_value - (uint)min.m_value;
      uVar2 = uVar22 & 0xff;
      local_50 = (ulong)(uint)(iVar11 * 3);
      local_58 = (ulong)(uint)(iVar11 * 4);
      local_60 = (ulong)(uint)(iVar11 * 5);
      iVar11 = 2;
      iVar12 = 3;
      local_90 = 0;
      local_68 = (ulong)(uint)count;
      local_40 = uVar18;
      do {
        local_a4 = 0;
        while( true ) {
          WVar8.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar3 = deRandom_getUint32(&local_80);
            WVar8.m_value = (char)(dVar3 % uVar7) + min.m_value;
          }
          bVar20 = (byte)uVar22;
          cVar13 = WVar8.m_value - WVar8.m_value % bVar20;
          uVar16 = (ushort)uVar22;
          uVar17 = uVar16;
          if (bVar20 < (byte)(max.m_value - cVar13)) {
            dVar3 = deRandom_getUint32(&local_80);
            uVar17 = (ushort)(byte)((char)(dVar3 % ((byte)(max.m_value - cVar13) - uVar2)) + bVar20)
            ;
          }
          WVar8.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar3 = deRandom_getUint32(&local_80);
            WVar8.m_value = (char)(dVar3 % uVar7) + min.m_value;
          }
          cVar19 = WVar8.m_value - WVar8.m_value % bVar20;
          if (bVar20 < (byte)(max.m_value - cVar19)) {
            dVar3 = deRandom_getUint32(&local_80);
            uVar16 = (ushort)(byte)((char)(dVar3 % ((byte)(max.m_value - cVar19) - uVar2)) + bVar20)
            ;
          }
          if (componentCount < 3) {
            bVar10 = 0;
          }
          else {
            WVar8.m_value = min.m_value;
            if (min.m_value < max.m_value) {
              dVar3 = deRandom_getUint32(&local_80);
              WVar8.m_value = (char)(dVar3 % uVar7) + min.m_value;
            }
            bVar10 = WVar8.m_value - WVar8.m_value % bVar20;
          }
          bVar5 = 1;
          if (3 < componentCount) {
            WVar8.m_value = min.m_value;
            if (min.m_value < max.m_value) {
              dVar3 = deRandom_getUint32(&local_80);
              WVar8.m_value = (char)(dVar3 % uVar7) + min.m_value;
            }
            bVar5 = WVar8.m_value - WVar8.m_value % bVar20;
          }
          bVar14 = (char)uVar17 - (char)((uVar17 & 0xff) % (ushort)bVar20);
          bVar20 = (char)uVar16 - (char)((uVar16 & 0xff) % (ushort)bVar20);
          if ((componentCount < 3) ||
             ((((ushort)uVar2 <= (ushort)((ushort)bVar10 + (ushort)bVar14) &&
               ((ushort)uVar2 <= (ushort)((ushort)bVar5 + (ushort)bVar20))) || (2 < local_a4))))
          break;
          local_a4 = local_a4 + 1;
        }
        iVar4 = iVar6 * (int)local_90;
        iVar1 = (int)local_40;
        cVar15 = bVar14 + cVar13;
        local_48[iVar4] = cVar13;
        local_48[(long)iVar4 + 1] = cVar19;
        local_48[iVar4 + iVar1] = cVar15;
        local_48[iVar4 + 1 + iVar1] = cVar19;
        cVar21 = bVar20 + cVar19;
        lVar9 = (long)((int)local_38 + iVar4);
        local_48[lVar9] = cVar13;
        local_48[lVar9 + 1] = cVar21;
        local_48[iVar4 + (int)local_50] = cVar13;
        local_48[iVar4 + 1 + (int)local_50] = cVar21;
        lVar9 = (long)(iVar4 + (int)local_58);
        local_48[lVar9] = cVar15;
        local_48[lVar9 + 1] = cVar19;
        local_48[iVar4 + (int)local_60] = cVar15;
        local_48[iVar4 + (int)local_60 + 1] = cVar21;
        if (2 < componentCount) {
          lVar9 = 6;
          iVar4 = iVar11;
          do {
            local_48[iVar4] = bVar10;
            iVar4 = iVar4 + iVar1;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        if (3 < componentCount) {
          lVar9 = 6;
          iVar4 = iVar12;
          do {
            local_48[iVar4] = bVar5;
            iVar4 = iVar4 + iVar1;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        local_90 = local_90 + 1;
        iVar11 = iVar11 + iVar6;
        iVar12 = iVar12 + iVar6;
      } while (local_90 != local_68);
    }
  }
  return local_70;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}